

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy_test.cc
# Opt level: O0

void __thiscall
disruptor::test::SleepingStrategy::SignalAlertWaitingOnDependents::~SignalAlertWaitingOnDependents
          (SignalAlertWaitingOnDependents *this)

{
  StrategyFixture<disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>_>
  ::~StrategyFixture((StrategyFixture<disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>_>
                      *)0x12c1ce);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SignalAlertWaitingOnDependents) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(strategy.WaitFor(kFirstSequenceValue, cursor,
                                        allDependents(), alerted));
  });

  cursor.IncrementAndGet(1L);
  strategy.SignalAllWhenBlocking();
  // dependents haven't moved, WaitFor() should still block.
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_1.IncrementAndGet(1L);
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_2.IncrementAndGet(1L);
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  alerted.store(true);

  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kAlertedSignal);
}